

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O2

void __thiscall BackwardPass::ProcessLoop(BackwardPass *this,BasicBlock *lastBlock)

{
  undefined1 *puVar1;
  Loop *loop;
  Type pJVar2;
  Loop *pLVar3;
  code *pcVar4;
  bool bVar5;
  uint sourceContextId;
  uint functionId;
  BVSparse<Memory::JitArenaAllocator> *pBVar6;
  undefined4 *puVar7;
  Type *ppFVar8;
  undefined1 uVar9;
  BasicBlock *block;
  BasicBlock *pBVar10;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *pSVar11;
  Iterator local_48;
  undefined1 local_31;
  
  bVar5 = IsTraceEnabled(this);
  if (bVar5) {
    Output::Print(L"******* PREPASS START ********\n");
  }
  loop = lastBlock->loop;
  uVar9 = this->isLoopPrepass;
  this->isLoopPrepass = true;
  sourceContextId = Func::GetSourceContextId(this->func);
  functionId = Func::GetLocalFunctionId(this->func);
  bVar5 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_01447bf0,LiveOutFieldsPhase,sourceContextId,functionId);
  if ((bVar5) &&
     ((bVar5 = GlobOpt::DoFieldOpts(this->globOpt,loop), bVar5 ||
      (bVar5 = GlobOpt::DoObjTypeSpec(this->globOpt,loop), bVar5)))) {
    local_31 = uVar9;
    pBVar6 = (BVSparse<Memory::JitArenaAllocator> *)
             new<Memory::JitArenaAllocator>(0x20,this->func->m_fg->alloc,0x3d6ef4);
    pJVar2 = this->func->m_fg->alloc;
    pBVar6->head = (Type_conflict)0x0;
    pBVar6->lastFoundIndex = (Type_conflict)0x0;
    pBVar6->alloc = pJVar2;
    pBVar6->lastUsedNodePrevNextField = (Type)pBVar6;
    pSVar11 = &(lastBlock->succList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
    local_48.list = pSVar11;
    local_48.current = &pSVar11->super_SListNodeBase<Memory::ArenaAllocator>;
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    while( true ) {
      if (pSVar11 == (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar5) goto LAB_003c67ab;
        *puVar7 = 0;
        pSVar11 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_48.current;
      }
      pSVar11 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
                (((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
                 &pSVar11->super_SListNodeBase<Memory::ArenaAllocator>)->
                super_SListNodeBase<Memory::ArenaAllocator>).next;
      if (pSVar11 == local_48.list) break;
      local_48.current = (NodeBase *)pSVar11;
      ppFVar8 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data(&local_48);
      pBVar10 = (*ppFVar8)->succBlock;
      if (pBVar10 == (BasicBlock *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x666,"(blockSucc)","blockSucc");
        if (!bVar5) goto LAB_003c67ab;
        *puVar7 = 0;
      }
      pLVar3 = pBVar10->loop;
      pSVar11 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_48.current;
      if (pLVar3 != loop) {
        if ((pLVar3 != (Loop *)0x0) && ((pLVar3->field_0x178 & 4) == 0)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar7 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x66d,"(!blockSucc->loop || blockSucc->loop->hasDeadStorePrepass)",
                             "!blockSucc->loop || blockSucc->loop->hasDeadStorePrepass");
          if (!bVar5) goto LAB_003c67ab;
          *puVar7 = 0;
        }
        BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
                  (pBVar6,pBVar10->upwardExposedFields);
        pSVar11 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_48.current;
      }
    }
    lastBlock->loop->liveOutFields = pBVar6;
    uVar9 = local_31;
  }
  if ((this->tag == DeadStorePhase) && ((loop->field_0x178 & 2) == 0)) {
    if (this->isCollectionPass == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x679,"(!IsCollectionPass())","!IsCollectionPass()");
      if (!bVar5) goto LAB_003c67ab;
      *puVar7 = 0;
    }
    if (this->currentPrePassLoop != (Loop *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x67a,"(!IsPrePass())","!IsPrePass()");
      if (!bVar5) goto LAB_003c67ab;
      *puVar7 = 0;
    }
    this->isCollectionPass = true;
    ProcessLoopCollectionPass(this,lastBlock);
    this->isCollectionPass = false;
  }
  if (this->currentPrePassLoop != (Loop *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x680,"(!this->IsPrePass())","!this->IsPrePass()");
    if (!bVar5) goto LAB_003c67ab;
    *puVar7 = 0;
  }
  this->currentPrePassLoop = loop;
  pBVar10 = lastBlock;
  if (this->tag == BackwardPhase) {
    if (loop->symsAssignedToInLoop != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x685,"(loop->symsAssignedToInLoop == nullptr)",
                         "loop->symsAssignedToInLoop == nullptr");
      if (!bVar5) goto LAB_003c67ab;
      *puVar7 = 0;
    }
    pBVar6 = (BVSparse<Memory::JitArenaAllocator> *)
             new<Memory::JitArenaAllocator>(0x20,this->globOpt->alloc,0x3d6ef4);
    pJVar2 = this->globOpt->alloc;
    pBVar6->head = (Type_conflict)0x0;
    pBVar6->lastFoundIndex = (Type_conflict)0x0;
    pBVar6->alloc = pJVar2;
    pBVar6->lastUsedNodePrevNextField = (Type)pBVar6;
    loop->symsAssignedToInLoop = pBVar6;
    if (loop->preservesNumberValue != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x687,"(loop->preservesNumberValue == nullptr)",
                         "loop->preservesNumberValue == nullptr");
      if (!bVar5) goto LAB_003c67ab;
      *puVar7 = 0;
    }
    pBVar6 = (BVSparse<Memory::JitArenaAllocator> *)
             new<Memory::JitArenaAllocator>(0x20,this->globOpt->alloc,0x3d6ef4);
    pJVar2 = this->globOpt->alloc;
    pBVar6->head = (Type_conflict)0x0;
    pBVar6->lastFoundIndex = (Type_conflict)0x0;
    pBVar6->alloc = pJVar2;
    pBVar6->lastUsedNodePrevNextField = (Type)pBVar6;
    loop->preservesNumberValue = pBVar6;
  }
  for (; pBVar10 != (BasicBlock *)0x0; pBVar10 = pBVar10->prev) {
    if ((((*(ushort *)&pBVar10->field_0x18 & 3) != 1) &&
        (ProcessBlock(this,pBVar10), (pBVar10->field_0x18 & 4) != 0)) &&
       (pBVar10->loop == lastBlock->loop)) {
      this->currentPrePassLoop = (Loop *)0x0;
      goto LAB_003c676f;
    }
  }
  this->currentPrePassLoop = (Loop *)0x0;
  if (lastBlock == (BasicBlock *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x697,"(lastBlock)","lastBlock");
    if (!bVar5) {
LAB_003c67ab:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar7 = 0;
  }
LAB_003c676f:
  puVar1 = &lastBlock->loop->field_0x178;
  *(ushort *)puVar1 = *(ushort *)puVar1 | 4;
  this->isLoopPrepass = (bool)uVar9;
  bVar5 = IsTraceEnabled(this);
  if (bVar5) {
    Output::Print(L"******** PREPASS END *********\n");
  }
  return;
}

Assistant:

void
BackwardPass::ProcessLoop(BasicBlock * lastBlock)
{
#if DBG_DUMP
    if (this->IsTraceEnabled())
    {
        Output::Print(_u("******* PREPASS START ********\n"));
    }
#endif

    Loop *loop = lastBlock->loop;

    bool prevIsLoopPrepass = this->isLoopPrepass;
    this->isLoopPrepass = true;

    // This code doesn't work quite as intended. It is meant to capture fields that are live out of a loop to limit the
    // number of implicit call bailouts the forward pass must create (only compiler throughput optimization, no impact
    // on emitted code), but because it looks only at the lexically last block in the loop, it does the right thing only
    // for do-while loops. For other loops (for and while) the last block does not exit the loop. Even for do-while loops
    // this tracking can have the adverse effect of killing fields that should stay live after copy prop. Disabled by default.
    // Left in under a flag, in case we find compiler throughput issues and want to do additional experiments.
    if (PHASE_ON(Js::LiveOutFieldsPhase, this->func))
    {
        if (this->globOpt->DoFieldOpts(loop) || this->globOpt->DoFieldRefOpts(loop))
        {
            // Get the live-out set at the loop bottom.
            // This may not be the only loop exit, but all loop exits either leave the function or pass through here.
            // In the forward pass, we'll use this set to trim the live fields on exit from the loop
            // in order to limit the number of bailout points following the loop.
            BVSparse<JitArenaAllocator> *bv = JitAnew(this->func->m_fg->alloc, BVSparse<JitArenaAllocator>, this->func->m_fg->alloc);
            FOREACH_SUCCESSOR_BLOCK(blockSucc, lastBlock)
            {
                if (blockSucc->loop != loop)
                {
                    // Would like to assert this, but in strange exprgen cases involving "break LABEL" in nested
                    // loops the loop graph seems to get confused.
                    //Assert(!blockSucc->loop || blockSucc->loop->IsDescendentOrSelf(loop));
                    Assert(!blockSucc->loop || blockSucc->loop->hasDeadStorePrepass);

                    bv->Or(blockSucc->upwardExposedFields);
                }
            }
            NEXT_SUCCESSOR_BLOCK;
            lastBlock->loop->liveOutFields = bv;
        }
    }

    if(tag == Js::DeadStorePhase && !loop->hasDeadStoreCollectionPass)
    {
        Assert(!IsCollectionPass());
        Assert(!IsPrePass());
        isCollectionPass = true;
        ProcessLoopCollectionPass(lastBlock);
        isCollectionPass = false;
    }

    Assert(!this->IsPrePass());
    this->currentPrePassLoop = loop;

    if (tag == Js::BackwardPhase)
    {
        Assert(loop->symsAssignedToInLoop == nullptr);
        loop->symsAssignedToInLoop = JitAnew(this->globOpt->alloc, BVSparse<JitArenaAllocator>, this->globOpt->alloc);
        Assert(loop->preservesNumberValue == nullptr);
        loop->preservesNumberValue = JitAnew(this->globOpt->alloc, BVSparse<JitArenaAllocator>, this->globOpt->alloc);
    }

    FOREACH_BLOCK_BACKWARD_IN_RANGE_DEAD_OR_ALIVE(block, lastBlock, nullptr)
    {
        this->ProcessBlock(block);

        if (block->isLoopHeader && block->loop == lastBlock->loop)
        {
            break;
        }
    }
    NEXT_BLOCK_BACKWARD_IN_RANGE_DEAD_OR_ALIVE;

    this->currentPrePassLoop = nullptr;
    Assert(lastBlock);
    __analysis_assume(lastBlock);
    lastBlock->loop->hasDeadStorePrepass = true;

    this->isLoopPrepass = prevIsLoopPrepass;

#if DBG_DUMP
    if (this->IsTraceEnabled())
    {
        Output::Print(_u("******** PREPASS END *********\n"));
    }
#endif
}